

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O1

void generate_convert_field
               (dill_stream c,ConvStatus conv_status,dill_reg src_addr,size_t src_offset,
               dill_reg dest_addr,size_t dest_offset,dill_reg rt_conv_status,IOconvFieldStruct *conv
               ,FMTypeDesc *type_desc,int data_already_copied)

{
  short sVar1;
  short sVar2;
  int *piVar3;
  jmp_data *pjVar4;
  _FMgetFieldStruct src;
  _FMgetFieldStruct tmp_spec_00;
  _FMgetFieldStruct src_00;
  iogen_oprnd src_oprnd;
  iogen_oprnd oprnd;
  iogen_oprnd src_oprnd_00;
  iogen_oprnd oprnd_00;
  iogen_oprnd src_01;
  iogen_oprnd oprnd_01;
  undefined1 auVar5 [24];
  undefined1 uVar6;
  dill_reg src_addr_00;
  uint uVar7;
  uint uVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined4 uVar13;
  int iVar14;
  FMTypeEnum FVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  jmp_table pjVar19;
  char *pcVar20;
  ssize_t sVar21;
  FMTypeDesc *pFVar22;
  dill_stream s;
  dill_reg new_src;
  ulong uVar23;
  conv_routine p_Var24;
  arith_op3i *pp_Var25;
  long lVar26;
  size_t dest_offset_00;
  dill_reg new_dest;
  bool bVar27;
  _FMgetFieldStruct tmp_spec;
  dill_reg actual_dest_reg;
  dill_reg actual_src_reg;
  int in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffefc;
  dill_reg dVar28;
  FMdata_type FVar29;
  undefined8 in_stack_ffffffffffffff08;
  dill_reg *pdVar30;
  undefined8 uVar31;
  int in_stack_ffffffffffffff18;
  iogen_oprnd local_d8;
  size_t local_a8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  _FMgetFieldStruct local_88;
  _FMgetFieldStruct local_70;
  iogen_oprnd local_58;
  
  uVar9 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  switch(type_desc->type) {
  case FMType_pointer:
    local_d8.offset._0_1_ = (conv->src_field).byte_swap;
    local_d8.offset._1_1_ = (conv->src_field).src_float_format;
    local_d8.offset._2_1_ = (conv->src_field).target_float_format;
    local_d8.offset._3_5_ = *(undefined5 *)&(conv->src_field).field_0x13;
    local_d8._0_8_ = (conv->src_field).offset;
    local_d8.size = (conv->src_field).size;
    local_d8._12_4_ = (conv->src_field).data_type;
    pdVar30 = (dill_reg *)CONCAT44(uVar9,src_addr);
    dVar28 = rt_conv_status;
    local_a8 = src_offset;
    uVar9 = dill_alloc_label(c,0);
    local_a0 = CONCAT44(local_a0._4_4_,uVar9);
    local_d8.address = 0;
    local_d8.data_type = unknown_type;
    local_d8.size = conv_status->src_pointer_size;
    auVar5._4_4_ = local_d8._12_4_;
    auVar5._0_4_ = conv_status->src_pointer_size;
    auVar5._8_4_ = (int)local_d8.offset;
    auVar5._12_4_ = (int)(local_d8.offset >> 0x20);
    auVar5._16_8_ = 0;
    gen_convert_address_field
              (c,(_FMgetFieldStruct)(auVar5 << 0x40),(int)pdVar30,(dill_reg)local_a8,
               (long)conv_status->target_pointer_size,conv_status->src_offset_adjust,rt_conv_status,
               (size_t)&local_58,(size_t)&local_70,conv_status->register_args,
               CONCAT44(in_stack_fffffffffffffefc,uVar9),(dill_reg *)CONCAT44(dest_addr,dVar28),
               pdVar30,(int)dest_offset,(int)conv);
    iVar17 = dill_getreg(c,8);
    src_addr_00 = dill_getreg(c,8);
    (*c->j->mov)(c,8,0,src_addr_00,local_58.address);
    (*c->j->mov)(c,8,0,iVar17,(int)local_70.offset);
    generate_convert_field
              (c,conv_status,src_addr_00,0,iVar17,0,dVar28,conv,type_desc->next,
               (uint)(conv_status->global_conv->conversion_type == direct_to_mem));
    dill_mark_label(c,local_a0 & 0xffffffff);
    pjVar19 = c->j;
    iVar10 = 8;
    iVar17 = (int)local_70.offset;
    break;
  case FMType_array:
    if (conv->rc_swap != no_row_column_swap) {
      uVar31 = CONCAT44(uVar9,src_addr);
      local_d8.offset._0_1_ = (conv->src_field).byte_swap;
      local_d8.offset._1_1_ = (conv->src_field).src_float_format;
      local_d8.offset._2_1_ = (conv->src_field).target_float_format;
      local_d8.offset._3_5_ = *(undefined5 *)&(conv->src_field).field_0x13;
      local_d8._0_8_ = (conv->src_field).offset;
      local_d8.size = (conv->src_field).size;
      local_d8._12_4_ = (conv->src_field).data_type;
      local_90 = CONCAT71(local_90._1_7_,conv->rc_swap == swap_source_column_major);
      iVar17 = conv->iovar->dimen_count;
      FVar29 = (conv->src_field).data_type;
      local_a8 = src_offset;
      iVar10 = dill_getreg(c,8);
      iVar11 = dill_getreg(c,4);
      iVar12 = dill_getreg(c,8);
      local_a0 = (long)iVar17 << 2;
      uVar9 = dill_getvblock(c,local_a0 & 0xffffffff);
      uVar13 = dill_getvblock(c,0x18);
      local_98 = CONCAT44(local_98._4_4_,uVar13);
      dill_virtual_lea(c,iVar10,uVar9);
      dill_virtual_lea(c,iVar12,local_98 & 0xffffffff);
      if (type_desc->type == FMType_array) {
        lVar26 = 0;
        do {
          if ((long)type_desc->static_size == 0) {
            (*c->j->loadi)(c,4,0,iVar11,*(int *)&conv_status->control_value,
                           (long)type_desc->control_field_index << 2);
          }
          else {
            (*c->j->set)(c,4,0,iVar11,(long)type_desc->static_size);
          }
          (*c->j->storei)(c,4,0,iVar11,iVar10,lVar26);
          type_desc = type_desc->next;
          lVar26 = lVar26 + 4;
        } while (type_desc->type == FMType_array);
      }
      uVar6 = (undefined1)local_90;
      (*c->j->set)(c,4,0,iVar11,0);
      (*c->j->storei)(c,4,0,iVar11,iVar10,local_a0);
      (*c->j->storei)(c,4,0,iVar11,iVar12,0);
      uVar23 = 4;
      do {
        (*c->j->set)(c,4,0,iVar11,(long)*(int *)((long)&local_d8.address + uVar23));
        (*c->j->storei)(c,4,0,iVar11,iVar12,uVar23);
        iVar17 = (int)uVar31;
        bVar27 = uVar23 < 0x14;
        uVar23 = uVar23 + 4;
      } while (bVar27);
      iVar11 = dill_getreg(c,8);
      iVar14 = dill_getreg(c,8);
      pjVar4 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar4[0x28].data1,(int)pjVar4[0x28].data2,iVar11,iVar17,local_a8);
      pjVar4 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar4[0x28].data1,(int)pjVar4[0x28].data2,iVar14,dest_addr,dest_offset);
      dill_scallv(c,transpose_array,"transpose_array","%p%p%p%I%I%I%p",iVar10,iVar11,iVar14,uVar6,
                  FVar29,conv->dest_size,iVar12);
      return;
    }
    FVar15 = type_desc->type;
    local_90 = 1;
    if (FVar15 == FMType_array) {
      iVar17 = 1;
      pFVar22 = type_desc;
      do {
        iVar17 = iVar17 * (pFVar22->static_size + (uint)(pFVar22->static_size == 0));
        pFVar22 = pFVar22->next;
        FVar15 = pFVar22->type;
      } while (FVar15 == FMType_array);
      local_90 = (long)iVar17;
    }
    iVar17 = (conv->src_field).size;
    local_98 = (ulong)iVar17;
    if (((((data_already_copied != 0) && ((conv->src_field).byte_swap == '\0')) &&
         ((conv->src_field).src_float_format == (conv->src_field).target_float_format)) &&
        ((iVar17 == conv->dest_size && (conv->subconversion == (IOConversionPtr)0x0)))) &&
       (((FVar15 & ~FMType_string) != FMType_pointer && ((conv->src_field).data_type != string_type)
        ))) {
      return;
    }
    uVar31 = CONCAT44(uVar9,data_already_copied);
    local_a8 = src_offset;
    iVar17 = dill_getreg(c,8);
    iVar10 = dill_getreg(c,8);
    (*c->j->mov)(c,8,0,iVar17,src_addr);
    (*c->j->mov)(c,8,0,iVar10,dest_addr);
    iVar11 = dill_getreg(c,4);
    pjVar4 = c->j->a3i_data;
    local_a0 = CONCAT44(local_a0._4_4_,iVar17);
    (*c->j->jmp_a3i[0x28])(c,(int)pjVar4[0x28].data1,(int)pjVar4[0x28].data2,iVar17,iVar17,local_a8)
    ;
    pjVar4 = c->j->a3i_data;
    local_a8 = CONCAT44(local_a8._4_4_,iVar10);
    (*c->j->jmp_a3i[0x28])
              (c,(int)pjVar4[0x28].data1,(int)pjVar4[0x28].data2,iVar10,iVar10,dest_offset);
    iVar12 = dill_alloc_label(c,0);
    iVar17 = dill_alloc_label(c,0);
    (*c->j->set)(c,4,0,iVar11,local_90);
    iVar10 = (int)uVar31;
    FVar15 = type_desc->type;
    while (FVar15 == FMType_array) {
      if (type_desc->static_size == 0) {
        iVar10 = *(int *)&conv_status->control_value;
        iVar14 = type_desc->control_field_index;
        iVar16 = dill_getreg(c,4);
        (*c->j->loadi)(c,4,0,iVar16,iVar10,(long)iVar14 << 2);
        pjVar4 = c->j->a3_data;
        (*c->j->jmp_a3[8])(c,(int)pjVar4[8].data1,(int)pjVar4[8].data2,iVar11,iVar11,iVar16);
      }
      iVar10 = (int)uVar31;
      type_desc = type_desc->next;
      FVar15 = type_desc->type;
    }
    iVar14 = rt_conv_status;
    if (iVar10 == 0) {
      sVar21 = decode_size_delta(conv_status,conv,type_desc);
      if (conv_status->global_conv->conversion_type == copy_dynamic_portion) {
        iVar14 = 0;
        switch(FVar15) {
        case FMType_pointer:
        case FMType_string:
          iVar14 = conv_status->src_pointer_size;
          break;
        case FMType_subformat:
          iVar14 = conv->subconversion->ioformat->body->record_length;
          break;
        case FMType_simple:
          iVar14 = (conv->src_field).size;
        }
        iVar16 = dill_getreg(c,4);
        pjVar4 = c->j->a3i_data;
        (*c->j->jmp_a3i[8])(c,(int)pjVar4[8].data1,(int)pjVar4[8].data2,iVar16,iVar11,(long)iVar14);
        dill_scallv(c,memcpy,"memcpy","%p%p%i",local_a8 & 0xffffffff,local_a0 & 0xffffffff,iVar16);
      }
      iVar14 = rt_conv_status;
      if (sVar21 != 0) {
        iVar16 = dill_getreg(c,4);
        iVar18 = dill_getreg(c,4);
        pjVar4 = c->j->a3i_data;
        (*c->j->jmp_a3i[8])(c,(int)pjVar4[8].data1,(int)pjVar4[8].data2,iVar16,iVar11,sVar21);
        iVar14 = rt_conv_status;
        (*c->j->loadi)(c,8,0,iVar18,rt_conv_status,8);
        pjVar4 = c->j->a3_data;
        (*c->j->jmp_a3[0x28])
                  (c,(int)pjVar4[0x28].data1,(int)pjVar4[0x28].data2,iVar18,iVar18,iVar16);
        (*c->j->storei)(c,8,0,iVar18,rt_conv_status,8);
      }
    }
    if (_debug_code_generation != 0) {
      dill_scallv(c,printf,"printf","%P%P%p","format %s, field Initial loopvar = %x\n",
                  conv_status->global_conv->ioformat->body->format_name,iVar11);
    }
    pjVar4 = c->j->b_data;
    (*c->j->jmp_bi[0x25])(c,(int)pjVar4[0x25].data1,(int)pjVar4[0x25].data2,iVar11,0,iVar17);
    dill_mark_label(c,iVar12);
    dVar28 = (dill_reg)local_a0;
    iVar16 = (int)local_a8;
    generate_convert_field
              (c,conv_status,(dill_reg)local_a0,0,(int)local_a8,0,iVar14,conv,type_desc,iVar10);
    pjVar4 = c->j->a3i_data;
    (*c->j->jmp_a3i[4])(c,(int)pjVar4[4].data1,(int)pjVar4[4].data2,iVar11,iVar11,1);
    if (((conv->iovar->type_desc).type == FMType_pointer) &&
       (((conv->iovar->type_desc).next)->next->type == FMType_pointer)) {
      pjVar4 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar4[0x28].data1,(int)pjVar4[0x28].data2,dVar28,dVar28,
                 (long)conv_status->src_pointer_size);
      pp_Var25 = c->j->jmp_a3i;
      pjVar4 = c->j->a3i_data;
      sVar1 = pjVar4[0x28].data1;
      sVar2 = pjVar4[0x28].data2;
      iVar10 = conv_status->target_pointer_size;
    }
    else {
      pjVar4 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar4[0x28].data1,(int)pjVar4[0x28].data2,dVar28,dVar28,local_98);
      pp_Var25 = c->j->jmp_a3i;
      pjVar4 = c->j->a3i_data;
      sVar1 = pjVar4[0x28].data1;
      sVar2 = pjVar4[0x28].data2;
      iVar10 = conv->dest_size;
    }
    (*pp_Var25[0x28])(c,(int)sVar1,(int)sVar2,iVar16,iVar16,(long)iVar10);
    if (_debug_code_generation != 0) {
      dill_scallv(c,printf,"printf","%P%p%p%p","loopvar = %x, src %x, dest %x\n",iVar11,dVar28,
                  iVar16);
    }
    pjVar4 = c->j->b_data;
    (*c->j->jmp_bi[0x1a])(c,(int)pjVar4[0x1a].data1,(int)pjVar4[0x1a].data2,iVar11,0,iVar12);
    dill_mark_label(c,iVar17);
    return;
  case FMType_string:
    local_d8.size = (conv->src_field).size;
    local_d8._12_4_ = (conv->src_field).data_type;
    local_d8.offset._0_1_ = (conv->src_field).byte_swap;
    local_d8.offset._1_1_ = (conv->src_field).src_float_format;
    local_d8.offset._2_1_ = (conv->src_field).target_float_format;
    local_d8.offset._3_5_ = *(undefined5 *)&(conv->src_field).field_0x13;
    local_d8.address = 0;
    local_d8.data_type = unknown_type;
    pdVar30 = (dill_reg *)CONCAT44(uVar9,data_already_copied);
    uVar9 = dill_alloc_label(c,0);
    uVar13 = (undefined4)local_d8.offset;
    tmp_spec_00.size = local_d8.size;
    tmp_spec_00.offset._0_4_ = local_d8.address;
    tmp_spec_00.offset._4_4_ = local_d8.data_type;
    tmp_spec_00.data_type = local_d8._12_4_;
    tmp_spec_00.byte_swap = (char)uVar13;
    tmp_spec_00.src_float_format = (char)((uint)uVar13 >> 8);
    tmp_spec_00.target_float_format = (char)((uint)uVar13 >> 0x10);
    tmp_spec_00._19_1_ = (char)((uint)uVar13 >> 0x18);
    tmp_spec_00._20_4_ = (int)(local_d8.offset >> 0x20);
    gen_convert_address_field
              (c,tmp_spec_00,src_addr,(dill_reg)src_offset,(long)conv->dest_size,
               conv_status->src_offset_adjust,rt_conv_status,(size_t)&local_58,(size_t)&local_70,
               conv_status->register_args,CONCAT44(in_stack_fffffffffffffefc,uVar9),
               (dill_reg *)CONCAT44(dest_addr,rt_conv_status),pdVar30,(int)dest_offset,
               in_stack_ffffffffffffff18);
    if ((int)pdVar30 == 0) {
      dill_scallv(c,strcpy,"strcpy","%p%p",(int)local_70.offset,local_58.address);
    }
    dill_mark_label(c,uVar9);
    pjVar19 = c->j;
    iVar10 = 8;
    iVar17 = (int)local_70.offset;
    break;
  case FMType_subformat:
    pcVar20 = FFSTypeHandle_name(conv->subconversion->ioformat);
    if (conv->subconversion->conv_func == (conv_routine)0x0) {
      conv_status->global_conv->conv_pkg = (char *)0xffffffffffffffff;
    }
    iVar17 = conv_status->register_args;
    iVar10 = dill_getreg(c,8);
    iVar11 = dill_getreg(c,8);
    if (iVar17 == 0) {
      iVar17 = dill_getreg(c,8);
      pjVar4 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar4[0x28].data1,(int)pjVar4[0x28].data2,iVar10,src_addr,src_offset);
      pjVar4 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar4[0x28].data1,(int)pjVar4[0x28].data2,iVar11,dest_addr,dest_offset);
      (*c->j->loadi)(c,8,0,iVar17,c->dill_local_pointer,(long)rt_conv_status);
      p_Var24 = conv->subconversion->conv_func;
    }
    else {
      pjVar4 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar4[0x28].data1,(int)pjVar4[0x28].data2,iVar10,src_addr,src_offset);
      pjVar4 = c->j->a3i_data;
      iVar17 = rt_conv_status;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar4[0x28].data1,(int)pjVar4[0x28].data2,iVar11,dest_addr,dest_offset);
      p_Var24 = conv->subconversion->conv_func;
    }
    dill_scallp(c,p_Var24,pcVar20,"%p%p%p",iVar10,iVar11,iVar17);
    return;
  case FMType_simple:
    iVar17 = (conv->src_field).size;
    FVar29 = (conv->src_field).data_type;
    local_88.byte_swap = (conv->src_field).byte_swap;
    local_88.src_float_format = (conv->src_field).src_float_format;
    local_88.target_float_format = (conv->src_field).target_float_format;
    local_88._19_5_ = *(undefined5 *)&(conv->src_field).field_0x13;
    iVar10 = conv_status->global_conv->required_alignment;
    iVar11 = conv->dest_size;
    local_88.offset = 0;
    local_88.size = iVar17;
    local_88.data_type = FVar29;
    local_70.size = iVar11;
    local_70.data_type = FVar29;
    uVar7 = drisc_type(&local_88);
    uVar8 = drisc_type(&local_70);
    piVar3 = c->j->type_align;
    iVar12 = piVar3[uVar7];
    uVar23 = (ulong)uVar8;
    iVar14 = piVar3[uVar23];
    if ((iVar10 < iVar12) || (src_offset % (ulong)(long)iVar12 != 0)) {
      iVar12 = 0;
    }
    else {
      iVar12 = 1;
    }
    if ((iVar10 < iVar14) || (dest_offset % (ulong)(long)iVar14 != 0)) {
      iVar14 = 0;
    }
    else {
      iVar14 = 1;
    }
    if (FVar29 != float_type) {
      gen_operand(&local_d8,src_addr,src_offset,iVar17,FVar29,iVar12,(uint)local_88.byte_swap);
      if (local_d8.address != 0) {
        gen_load(c,&local_d8);
      }
      if (local_d8.data_type != FVar29) {
        src_oprnd.size = local_d8.size;
        src_oprnd.address = local_d8.address;
        src_oprnd.data_type = local_d8.data_type;
        src_oprnd._12_4_ = local_d8._12_4_;
        src_oprnd.offset._0_4_ = (int)local_d8.offset;
        src_oprnd.offset._4_4_ = (int)(local_d8.offset >> 0x20);
        src_oprnd.aligned = local_d8.aligned;
        src_oprnd.byte_swap = local_d8.byte_swap;
        src_oprnd.vc_reg = local_d8.vc_reg;
        src_oprnd.vc_reg2 = local_d8.vc_reg2;
        gen_type_conversion(&local_58,c,src_oprnd,FVar29);
        oprnd.size = local_d8.size;
        oprnd.address = local_d8.address;
        oprnd.data_type = local_d8.data_type;
        oprnd._12_4_ = local_d8._12_4_;
        oprnd.offset._0_4_ = (int)local_d8.offset;
        oprnd.offset._4_4_ = (int)(local_d8.offset >> 0x20);
        oprnd.aligned = local_d8.aligned;
        oprnd.byte_swap = local_d8.byte_swap;
        oprnd.vc_reg = local_d8.vc_reg;
        oprnd.vc_reg2 = local_d8.vc_reg2;
        free_oprnd(c,oprnd);
        local_d8.vc_reg = local_58.vc_reg;
        local_d8.vc_reg2 = local_58.vc_reg2;
        local_d8.data_type = local_58.data_type;
        local_d8.address = local_58.address;
        local_d8.offset = local_58.offset;
        local_d8.aligned = local_58.aligned;
        local_d8.byte_swap = local_58.byte_swap;
        local_d8.size = local_58.size;
        local_d8._12_4_ = local_58._12_4_;
      }
      if (local_d8.size != iVar11) {
        src_oprnd_00.size = local_d8.size;
        src_oprnd_00.address = local_d8.address;
        src_oprnd_00.data_type = local_d8.data_type;
        src_oprnd_00._12_4_ = local_d8._12_4_;
        src_oprnd_00.offset._0_4_ = (int)local_d8.offset;
        src_oprnd_00.offset._4_4_ = (int)(local_d8.offset >> 0x20);
        src_oprnd_00.aligned = local_d8.aligned;
        src_oprnd_00.byte_swap = local_d8.byte_swap;
        src_oprnd_00.vc_reg = local_d8.vc_reg;
        src_oprnd_00.vc_reg2 = local_d8.vc_reg2;
        gen_size_conversion(&local_58,c,src_oprnd_00,iVar11);
        oprnd_00.size = local_d8.size;
        oprnd_00.address = local_d8.address;
        oprnd_00.data_type = local_d8.data_type;
        oprnd_00._12_4_ = local_d8._12_4_;
        oprnd_00.offset._0_4_ = (int)local_d8.offset;
        oprnd_00.offset._4_4_ = (int)(local_d8.offset >> 0x20);
        oprnd_00.aligned = local_d8.aligned;
        oprnd_00.byte_swap = local_d8.byte_swap;
        oprnd_00.vc_reg = local_d8.vc_reg;
        oprnd_00.vc_reg2 = local_d8.vc_reg2;
        free_oprnd(c,oprnd_00);
        local_d8.vc_reg = local_58.vc_reg;
        local_d8.vc_reg2 = local_58.vc_reg2;
        local_d8.data_type = local_58.data_type;
        local_d8.address = local_58.address;
        local_d8.offset = local_58.offset;
        local_d8.aligned = local_58.aligned;
        local_d8.byte_swap = local_58.byte_swap;
        local_d8.size = local_58.size;
        local_d8._12_4_ = local_58._12_4_;
      }
      src_01.size = local_d8.size;
      src_01.address = local_d8.address;
      src_01.data_type = local_d8.data_type;
      src_01._12_4_ = local_d8._12_4_;
      src_01.offset._0_4_ = (int)local_d8.offset;
      src_01.offset._4_4_ = (int)(local_d8.offset >> 0x20);
      src_01.aligned = local_d8.aligned;
      src_01.byte_swap = local_d8.byte_swap;
      src_01.vc_reg = local_d8.vc_reg;
      src_01.vc_reg2 = local_d8.vc_reg2;
      gen_store(c,src_01,dest_addr,dest_offset,iVar11,FVar29,iVar14);
      oprnd_01.size = local_d8.size;
      oprnd_01.address = local_d8.address;
      oprnd_01.data_type = local_d8.data_type;
      oprnd_01._12_4_ = local_d8._12_4_;
      oprnd_01.offset._0_4_ = (int)local_d8.offset;
      oprnd_01.offset._4_4_ = (int)(local_d8.offset >> 0x20);
      oprnd_01.aligned = local_d8.aligned;
      oprnd_01.byte_swap = local_d8.byte_swap;
      oprnd_01.vc_reg = local_d8.vc_reg;
      oprnd_01.vc_reg2 = local_d8.vc_reg2;
      free_oprnd(c,oprnd_01);
      return;
    }
    if (iVar17 == iVar11) {
      uVar9 = local_88._16_4_;
      src.size = local_88.size;
      src.offset = local_88.offset;
      src.data_type = local_88.data_type;
      src.byte_swap = (char)uVar9;
      src.src_float_format = (char)((uint)uVar9 >> 8);
      src.target_float_format = (char)((uint)uVar9 >> 0x10);
      src._19_1_ = (char)((uint)uVar9 >> 0x18);
      src._20_4_ = local_88._20_4_;
      gen_mem_float_conv(c,src,src_addr,src_offset,iVar10,dest_addr,dest_offset,iVar11,
                         in_stack_fffffffffffffee8);
      return;
    }
    if (uVar7 == 4 || uVar8 == 4) {
      puts("must do call to conversion subroutine");
      return;
    }
    iVar17 = dill_getvblock(c,c->j->type_size[uVar23]);
    dest_offset_00 = (size_t)iVar17;
    uVar9 = local_88._16_4_;
    src_00.size = local_88.size;
    src_00.offset = local_88.offset;
    src_00.data_type = local_88.data_type;
    src_00.byte_swap = (char)uVar9;
    src_00.src_float_format = (char)((uint)uVar9 >> 8);
    src_00.target_float_format = (char)((uint)uVar9 >> 0x10);
    src_00._19_1_ = (char)((uint)uVar9 >> 0x18);
    src_00._20_4_ = local_88._20_4_;
    gen_mem_float_conv(c,src_00,src_addr,src_offset,iVar10,c->dill_local_pointer,dest_offset_00,
                       iVar11,in_stack_fffffffffffffee8);
    iVar17 = dill_getreg(c,10);
    if (uVar23 == 9) {
      (*c->j->loadi)(c,9,0,iVar17,c->dill_local_pointer,dest_offset_00);
      (*c->j->convert)(c,9,10,iVar17,iVar17);
      pjVar19 = c->j;
      iVar10 = 10;
    }
    else {
      if (uVar8 != 10) {
        return;
      }
      (*c->j->loadi)(c,10,0,iVar17,c->dill_local_pointer,dest_offset_00);
      (*c->j->convert)(c,10,9,iVar17,iVar17);
      pjVar19 = c->j;
      iVar10 = 9;
    }
    break;
  default:
    goto switchD_00112a43_default;
  }
  (*pjVar19->storei)(c,iVar10,0,iVar17,dest_addr,dest_offset);
switchD_00112a43_default:
  return;
}

Assistant:

static void
generate_convert_field(dill_stream c, ConvStatus conv_status, dill_reg src_addr,
		       size_t src_offset, dill_reg dest_addr, size_t dest_offset,
		       dill_reg rt_conv_status, IOconvFieldStruct *conv, FMTypeDesc *type_desc,
		       int data_already_copied)
{
    switch(type_desc->type) {
    case FMType_pointer: {
	dill_reg actual_src_reg, actual_dest_reg;
	struct _FMgetFieldStruct tmp_spec = conv->src_field;
	int null_target = dill_alloc_label(c, NULL);
	tmp_spec.offset = 0;
	tmp_spec.size = conv_status->src_pointer_size;
	
	gen_convert_address_field(c, tmp_spec, 0, src_addr, src_offset,
				  conv_status->target_pointer_size, 
				  dest_addr, dest_offset, 
				  conv_status->src_offset_adjust, 
				  rt_conv_status,
				  decode_size_delta(conv_status, conv, type_desc),
				  &actual_src_reg, &actual_dest_reg, 
				  conv_status->register_args, null_target);
	{
#ifdef RAW
	    int src_storage = ffs_local(c, DILL_P);
	    int dest_storage = ffs_local(c, DILL_P);
	    /* save values of src_addr and dest_addr */
	    dill_stpi(c, src_addr, dill_lp(c), src_storage);
	    dill_stpi(c, dest_addr, dill_lp(c), dest_storage);
#else
	    dill_reg tmp_src_reg, tmp_dest_reg;
	    ffs_getreg(c, &tmp_dest_reg, DILL_P, DILL_VAR);
	    ffs_getreg(c, &tmp_src_reg, DILL_P, DILL_VAR);
#endif
	    dill_movp(c, tmp_src_reg, actual_src_reg);
	    dill_movp(c, tmp_dest_reg, actual_dest_reg);
	    REG_DEBUG(("Putting %d and %d for new src & dest\n", 
		       actual_src_reg, actual_dest_reg));
	    ffs_putreg(c, actual_src_reg, DILL_P);
	    ffs_putreg(c, actual_dest_reg, DILL_P);
	    generate_convert_field(c, conv_status, tmp_src_reg, 0, 
				   tmp_dest_reg, 0, rt_conv_status,
				   conv, type_desc->next, conv_status->global_conv->conversion_type == direct_to_mem);
	    
#ifdef RAW
	    dill_ldpi(c, src_addr, dill_lp(c), src_storage);
	    dill_ldpi(c, dest_addr, dill_lp(c), dest_storage);
#endif
	}
	dill_mark_label(c, null_target);
	
#ifdef VERBOSE
	dill_scallv(c, (void*)printf, "printf", "%P%p",
		    "storing POINTER value %p\n",actual_dest_reg);
#endif
	dill_stpi(c, actual_dest_reg, dest_addr, dest_offset);

	break;
    }
    case FMType_string:{
	dill_reg actual_src_reg, actual_dest_reg;
	struct _FMgetFieldStruct tmp_spec = conv->src_field;
	tmp_spec.offset = 0;
	int null_target = dill_alloc_label(c, NULL);
	gen_convert_address_field(c, tmp_spec, 0, src_addr, src_offset,
				  conv->dest_size, dest_addr, dest_offset, 
				  conv_status->src_offset_adjust, 
				  rt_conv_status,
				  decode_size_delta(conv_status, conv, type_desc),
				  &actual_src_reg, &actual_dest_reg, 
				  conv_status->register_args, null_target);
	/* generate strcpy */
	if (!data_already_copied) {
#ifdef VERBOSE
	    dill_scallv(c, (void*)printf, "printf", "%P%p%p",
			"Calling Strcpy with args %p, %p\n",actual_dest_reg, actual_src_reg);

#endif
	    dill_scallv(c, (void*)strcpy, "strcpy", "%p%p", actual_dest_reg, actual_src_reg);

	}
	dill_mark_label(c, null_target);
	
	dill_stpi(c, actual_dest_reg, dest_addr, dest_offset);
	REG_DEBUG(("Putting %d and %d for new src & dest\n", 
		   actual_src_reg, actual_dest_reg));
	ffs_putreg(c, actual_src_reg, DILL_P);
	ffs_putreg(c, actual_dest_reg, DILL_P);
	break;
    }
    case FMType_subformat: {
	FFSTypeHandle subformat = conv->subconversion->ioformat;
	char *name = FFSTypeHandle_name(subformat);
	if (conv->subconversion->conv_func == NULL) {
	    /* we're not linking to an address that's valid, 
	       must fill it in later */
	    conv_status->global_conv->conv_pkg = (char *) -1;
	}
	    
	if (conv_status->register_args) {
	    dill_reg new_src, new_dest;
	    if (!ffs_getreg(c, &new_src, DILL_P, DILL_TEMP) ||
		!ffs_getreg(c, &new_dest, DILL_P, DILL_TEMP))
		gen_fatal("temp vals in subcall\n");
	    REG_DEBUG(("Getting %d and %d for new src & dest\n", 
		       new_src, new_dest));
	    dill_addpi(c, new_src, src_addr, src_offset);
	    dill_addpi(c, new_dest, dest_addr, dest_offset);
	    (void) dill_scallp(c, (void*)conv->subconversion->conv_func, name, "%p%p%p", new_src,
			      new_dest, rt_conv_status);
	    REG_DEBUG(("Putting %d and %d for new src & dest\n", 
		       new_src, new_dest));
	    if (debug_code_generation()) {
/*	        VCALL2V(printf, "%P%p",
	    "After subroutine call, new src_string_base is %p\n", src_string_base);*/
	    }
	    ffs_putreg(c, new_src, DILL_P);
	    ffs_putreg(c, new_dest, DILL_P);
	} else {
	    dill_reg reg_rt_conv_status;
	    dill_reg new_src, new_dest;
	    if (!ffs_getreg(c, &new_src, DILL_P, DILL_TEMP) ||
		!ffs_getreg(c, &new_dest, DILL_P, DILL_TEMP))
		gen_fatal("temp vals in subcall\n");
#ifdef RAW
	    int src_storage = ffs_local(c, DILL_P);
	    int dest_storage = ffs_local(c, DILL_P);

	    /* save values of src_addr and dest_addr */
	    dill_stpi(c, src_addr, dill_lp(c), src_storage);
	    dill_stpi(c, dest_addr, dill_lp(c), dest_storage);
#endif

	    if (!ffs_getreg(c, &reg_rt_conv_status, DILL_P, DILL_TEMP))
		gen_fatal("temp string vals in subcall\n");
	    REG_DEBUG(("Getting %d and %d for reg_rt_conv_status\n", reg_rt_conv_status));
	    dill_addpi(c, new_src, src_addr, src_offset);
	    dill_addpi(c, new_dest, dest_addr, dest_offset);
	    dill_ldpi(c, reg_rt_conv_status, dill_lp(c), rt_conv_status);
	    dill_scallp(c, (void*)conv->subconversion->conv_func, name, "%p%p%p", new_src,
			new_dest, reg_rt_conv_status);
	    REG_DEBUG(("Putting %d reg_rt_conv_status\n", reg_rt_conv_status));
	    ffs_putreg(c, reg_rt_conv_status, DILL_P);
	    /* restore values of src_addr and dest_addr */
#ifdef RAW
	    dill_ldpi(c, src_addr, dill_lp(c), src_storage);
	    dill_ldpi(c, dest_addr, dill_lp(c), dest_storage);
#endif
	}
	break;
    }
    case FMType_simple: {
	struct _FMgetFieldStruct tmp_spec = conv->src_field;
	tmp_spec.offset = 0;
	gen_simple_field_conv(c, tmp_spec, 
			      conv_status->global_conv->required_alignment, 
			      src_addr, src_offset, 
			      conv->dest_size, tmp_spec.data_type, 
			      dest_addr, dest_offset);
	break;
    }
    case FMType_array:
	if (conv->rc_swap == no_row_column_swap) {
	    int static_elements = 1;
	    struct _FMgetFieldStruct tmp_spec = conv->src_field;
	    FMTypeDesc *next = type_desc;
	    while (next->type == FMType_array) {
		if (next->static_size != 0) {
		    static_elements *= next->static_size;
		}
		next = next->next;
	    }
	
	    dill_reg loop_var;
	    int loop_var_type;

	    int loop_head, loop_end;
	    if (data_already_copied &&
		!conv->src_field.byte_swap &&
		(conv->src_field.src_float_format == conv->src_field.target_float_format) &&
		(conv->src_field.size == conv->dest_size) &&
		(conv->subconversion == NULL) &&
		(next->type != FMType_pointer) &&
		(next->type != FMType_string) &&
		((conv->src_field.data_type != string_type))) {
		/* Nothing but data movement required */
		    break;
	    }
#ifdef RAW
	    int src_storage = ffs_local(c, DILL_P);
	    int dest_storage = ffs_local(c, DILL_P);
	    int loop_storage = 0;

	    /* save values of src_addr and dest_addr */
	    dill_stpi(c, src_addr, dill_lp(c), src_storage);
	    dill_stpi(c, dest_addr, dill_lp(c), dest_storage);
#else
	    {
		dill_reg tmp_src, tmp_dest;
		ffs_getreg(c, &tmp_src, DILL_P,DILL_TEMP);
		ffs_getreg(c, &tmp_dest, DILL_P,DILL_TEMP);
		dill_movp(c, tmp_src, src_addr);
		dill_movp(c, tmp_dest, dest_addr);
		src_addr = tmp_src;
		dest_addr = tmp_dest;
	    }
#endif

	    if (((conv->subconversion == NULL)) &&
		!debug_code_generation()) {
		if (!ffs_getreg(c, &loop_var, DILL_I, DILL_TEMP))
		    gen_fatal("gen field convert out of registers BB \n");
		loop_var_type = DILL_TEMP;
	    } else {
		/* may call a subconversion in here, use VARs */
		if (!ffs_getreg(c, &loop_var, DILL_I, DILL_VAR))
		    gen_fatal("gen field convert out of registers CC\n");
		loop_var_type = DILL_VAR;
	    }
	    REG_DEBUG(("Getting1 %d as loop_var\n", _vrr(loop_var)));
	    dill_addpi(c, src_addr, src_addr, src_offset);
	    dill_addpi(c, dest_addr, dest_addr, dest_offset);

	    /* gen conversion loop */
	    loop_head = dill_alloc_label(c, NULL);
	    loop_end = dill_alloc_label(c, NULL);
	    dill_seti(c, loop_var, static_elements);
	    next = type_desc;
	    while (next->type == FMType_array) {
		if (next->static_size == 0) {
		    dill_reg addr_reg = (dill_reg)(intptr_t)conv_status->control_value;
		    dill_reg val;
		    int field = next->control_field_index;
		    ffs_getreg(c, &val, DILL_I, DILL_TEMP);
		    dill_ldii(c, val, addr_reg, field*sizeof(int));
		    dill_muli(c, loop_var, loop_var, val);
		}
		next = next->next;
	    }
	    if (!data_already_copied) {
		ssize_t base_delta = decode_size_delta(conv_status, conv, next);
		if (conv_status->global_conv->conversion_type == copy_dynamic_portion) {
		    int base_size = item_size(conv_status, conv, next);
		    dill_reg size;
		    ffs_getreg(c, &size, DILL_I, DILL_TEMP);
		    dill_mulii(c, size, loop_var, base_size);
#ifdef VERBOSE
		    dill_scallv(c, (void*)printf, "printf", "%P%p%p",
				"Calling Memcpy with args %p, %p, %d\n",dest_addr, src_addr, size);
#endif
		    dill_scallv(c, (void*)memcpy, "memcpy", "%p%p%i",
				dest_addr, src_addr, size);
		}
		if (base_delta != 0) {
		    dill_reg dest_src_ptr, delta;
		    ffs_getreg(c, &delta, DILL_I, DILL_TEMP);
		    ffs_getreg(c, &dest_src_ptr, DILL_I, DILL_TEMP);
		    dill_mulii(c, delta, loop_var, base_delta);
#ifdef VERBOSE
		    dill_scallv(c, (void*)printf, "printf", "%P%p",
				"Adjusting dest_pointer_base by %p\n", delta);
#endif
		    dill_ldpi(c, dest_src_ptr, rt_conv_status, FMOffset(RTConvStatus,dest_pointer_base));
		    dill_addp(c, dest_src_ptr, dest_src_ptr, delta);
		    dill_stpi(c, dest_src_ptr, rt_conv_status, FMOffset(RTConvStatus,dest_pointer_base));
		}
	    }

	    if (debug_code_generation()) {
		dill_scallv(c, (void*)printf, "printf", "%P%P%p",
			    "format %s, field Initial loopvar = %x\n", conv_status->global_conv->ioformat->body->format_name, loop_var);
	    }
	    
	    dill_bleii(c, loop_var, 0, loop_end);
	    dill_mark_label(c, loop_head);
#if defined(NOT) & defined(RAW)
	    if (!register_args) {
		/* store away loop var and free the reg */
		loop_storage = ffs_local(c, DILL_I);
		dill_stii(c, loop_var, dill_lp(c), loop_storage);
		REG_DEBUG(("Putting %d as loop_var\n", _vrr(loop_var)));
		ffs_putreg(c, loop_var, DILL_I);
	    }
#endif
	    generate_convert_field(c, conv_status, src_addr, 0, dest_addr, 0, 
				   rt_conv_status, conv, next, 
				   data_already_copied);
	    
	    (void)loop_var_type;  /* avoid warning */
#if defined(NOT) & defined(RAW)
	    /* generate end of loop */
	    if (!register_args) {
		/* store away loop var and free the reg */
		ffs_getreg(c, &loop_var, DILL_I, loop_var_type);
		REG_DEBUG(("Getting %d as loop_var\n", _vrr(loop_var)));
		dill_ldii(c, loop_var, dill_lp(c), loop_storage);
	    }
#endif
	    dill_subii(c, loop_var, loop_var, 1);
	    int array_of_pointers = 0;
	    if (conv->iovar->type_desc.type == FMType_pointer) {
		array_of_pointers = (conv->iovar->type_desc.next->next->type == FMType_pointer);
	    }
	    if (array_of_pointers) {
		dill_addpi(c, src_addr, src_addr, conv_status->src_pointer_size);
		dill_addpi(c, dest_addr, dest_addr, conv_status->target_pointer_size);
	    } else {
		dill_addpi(c, src_addr, src_addr, tmp_spec.size);
		dill_addpi(c, dest_addr, dest_addr, conv->dest_size);
	    }		
	    if (debug_code_generation()) {
		dill_scallv(c, (void*)printf, "printf", "%P%p%p%p",
			    "loopvar = %x, src %x, dest %x\n", loop_var,
			    src_addr, dest_addr);
	    }
	    dill_bgtii(c, loop_var, 0, loop_head);
	    dill_mark_label(c, loop_end);
	    ffs_putreg(c, loop_var, DILL_I);
	    REG_DEBUG(("Putting %d as loop_var\n", _vrr(loop_var)));
	
	    /* restore values of src_addr and dest_addr */
#ifdef RAW
	    dill_ldpi(c, src_addr, dill_lp(c), src_storage);
	    dill_ldpi(c, dest_addr, dill_lp(c), dest_storage);
#endif
	} else {
	    /* generate a call to transpose */
	    struct _FMgetFieldStruct tmp_spec = conv->src_field;
	    dill_reg dimens, dimen_reg, spec, spec_reg, tmp;
	    int source_column_major = 
		(conv->rc_swap == swap_source_column_major);
	    int dimen_count = conv->iovar->dimen_count;
	    FMdata_type dest_type = conv->src_field.data_type;

	    ffs_getreg(c, &dimen_reg, DILL_P, DILL_TEMP);
	    ffs_getreg(c, &tmp, DILL_I, DILL_TEMP);
	    ffs_getreg(c, &spec_reg, DILL_P, DILL_TEMP);
	    dimens = ffs_localb(c, dimen_count * sizeof(int));
	    spec = ffs_localb(c, sizeof(struct _FMgetFieldStruct));
	    dill_virtual_lea(c, dimen_reg, dimens);
	    dill_virtual_lea(c, spec_reg, spec);
	    FMTypeDesc *next = type_desc;
	    int i = 0;
	    while (next->type == FMType_array) {
		if (next->static_size != 0) {
		    dill_seti(c, tmp, next->static_size);
		} else {
		    dill_reg addr_reg = (dill_reg)(intptr_t)conv_status->control_value;
		    int field = next->control_field_index;
		    dill_ldii(c, tmp, addr_reg, field*sizeof(int));
		}
		dill_stii(c, tmp, dimen_reg, i * sizeof(int));
		i++;
		next = next->next;
	    }
	    dill_seti(c, tmp, 0);
	    dill_stii(c, tmp, dimen_reg, dimen_count * sizeof(int));
	    dill_stii(c, tmp, spec_reg, FMOffset(struct _IOgetFieldStruct *, offset));
	    for (i=4 ; i < sizeof(struct _IOgetFieldStruct); i+= 4) {
		dill_seti(c, tmp, *((int*)((char*)&tmp_spec + i)));
		dill_stii(c, tmp, spec_reg, i);
	    }
	    {
		dill_reg tmp_src, tmp_dest;
		ffs_getreg(c, &tmp_src, DILL_P,DILL_TEMP);
		ffs_getreg(c, &tmp_dest, DILL_P,DILL_TEMP);
		dill_addpi(c, tmp_src, src_addr, src_offset);
		dill_addpi(c, tmp_dest, dest_addr, dest_offset);
		src_addr = tmp_src;
		dest_addr = tmp_dest;
	    }
	    dill_scallv(c, (void*)transpose_array, "transpose_array",
			"%p%p%p%I%I%I%p", dimen_reg, src_addr, dest_addr,
			source_column_major, dest_type, conv->dest_size, spec_reg);
	}
	break;
    }
}